

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

void * malloc(size_t __size)

{
  mchunkptr pmVar1;
  malloc_chunk **ppmVar2;
  long *plVar3;
  size_t *psVar4;
  byte *pbVar5;
  char *pcVar6;
  malloc_tree_chunk *pmVar7;
  tbinptr pmVar8;
  size_t sVar9;
  uint uVar10;
  int iVar11;
  msegmentptr sp_1;
  malloc_tree_chunk *pmVar12;
  mstate pmVar13;
  void *pvVar14;
  malloc_chunk *pmVar15;
  mstate m;
  malloc_tree_chunk **ppmVar16;
  malloc_segment *pmVar17;
  tbinptr pmVar18;
  int *piVar19;
  size_t dvs;
  malloc_tree_chunk *pmVar20;
  mchunkptr pmVar21;
  tbinptr pmVar22;
  malloc_chunk **ppmVar23;
  tbinptr pmVar24;
  malloc_chunk *pmVar25;
  long lVar26;
  uint uVar27;
  char *pcVar28;
  ulong uVar29;
  mchunkptr pmVar30;
  malloc_chunk *pmVar31;
  malloc_tree_chunk **ppmVar32;
  long lVar33;
  byte bVar34;
  msegmentptr sp;
  mchunkptr pmVar35;
  char *pcVar36;
  mchunkptr q;
  ulong uVar37;
  char *pcVar38;
  ulong uVar39;
  bool bVar40;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar11 = _gm_.mutex;
  if (((byte)_gm_.mflags & 2) != 0) {
    uVar27 = 1;
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if (iVar11 != 0) {
      while (_gm_.mutex != 0) {
        if ((uVar27 & 0x3f) == 0) {
          sched_yield();
        }
        uVar27 = uVar27 + 1;
      }
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
    }
  }
  pmVar18 = (tbinptr)_gm_.top;
  if (__size < 0xe9) {
    pcVar28 = &DAT_00000020;
    if (0x16 < __size) {
      pcVar28 = (char *)(ulong)((int)__size + 0x17U & 0x1f0);
    }
    bVar34 = (byte)((ulong)pcVar28 >> 3);
    uVar27 = _gm_.smallmap >> (bVar34 & 0x1f);
    if ((uVar27 & 3) != 0) {
      uVar27 = (uVar27 & 1 | (uint)((ulong)pcVar28 >> 3)) ^ 1;
      uVar29 = (ulong)(uVar27 << 4);
      pcVar38 = (char *)((long)_gm_.smallbins + uVar29);
      pcVar28 = *(char **)((long)_gm_.smallbins + uVar29 + 0x10);
      uVar39 = (ulong)(uVar27 * 8);
      if ((*(ulong *)(pcVar28 + 8) & 0xfffffffffffffff8) != uVar39) {
        _PDCLIB_assert99("Assertion failed: chunksize(p) == small_index2size(idx), function ",
                         "malloc",
                         ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4649.\n"
                        );
      }
      pcVar36 = *(char **)(pcVar28 + 0x10);
      if (pcVar28 == pcVar38) {
        _PDCLIB_assert99("Assertion failed: p != b, function ","malloc",
                         ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4650.\n"
                        );
      }
      if (pcVar28 == pcVar36) {
        _PDCLIB_assert99("Assertion failed: p != F, function ","malloc",
                         ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4650.\n"
                        );
      }
      if ((*(ulong *)(pcVar28 + 8) & 0xfffffffffffffff8) != uVar39) {
        _PDCLIB_assert99("Assertion failed: chunksize(p) == small_index2size(idx), function ",
                         "malloc",
                         ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4650.\n"
                        );
      }
      if (pcVar38 == pcVar36) {
        bVar34 = (byte)uVar27 & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar34 | 0xfffffffeU >> 0x20 - bVar34);
      }
      else {
        if ((pcVar36 < _gm_.least_addr) || (*(char **)(pcVar36 + 0x18) != pcVar28))
        goto LAB_00104a4d;
        *(char **)(pcVar36 + 0x18) = pcVar38;
        *(char **)((long)_gm_.smallbins + uVar29 + 0x10) = pcVar36;
      }
      ppmVar16 = (malloc_tree_chunk **)(pcVar28 + 0x10);
      *(ulong *)(pcVar28 + 8) = uVar39 | 3;
      pcVar28[uVar39 + 8] = pcVar28[uVar39 + 8] | 1;
      goto LAB_00103a49;
    }
    if (pcVar28 <= _gm_.dvsize) goto LAB_00103921;
    if (uVar27 == 0) {
      if (_gm_.treemap == 0) goto LAB_00103921;
      uVar27 = 0;
      if (_gm_.treemap != 0) {
        for (; (_gm_.treemap >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      pmVar18 = _gm_.treebins[uVar27];
      pmVar24 = pmVar18;
      uVar29 = (pmVar18->head & 0xfffffffffffffff8) - (long)pcVar28;
      while ((pmVar12 = pmVar18->child[0], pmVar12 != (malloc_tree_chunk *)0x0 ||
             (pmVar12 = pmVar18->child[1], pmVar12 != (malloc_tree_chunk *)0x0))) {
        uVar39 = (pmVar12->head & 0xfffffffffffffff8) - (long)pcVar28;
        pmVar18 = pmVar12;
        if (uVar39 < uVar29) {
          pmVar24 = pmVar12;
          uVar29 = uVar39;
        }
      }
      if (pmVar24 < _gm_.least_addr) goto LAB_00104a4d;
      pcVar38 = pcVar28 + uVar29;
      if ((char *)(pmVar24->head & 0xfffffffffffffff8) != pcVar38) {
        _PDCLIB_assert99("Assertion failed: chunksize(v) == rsize + nb, function ","tmalloc_small",
                         ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4586.\n"
                        );
      }
      pmVar18 = pmVar24->bk;
      pmVar12 = pmVar24->parent;
      if (pmVar18 == pmVar24) {
        if (pmVar24->child[1] == (tbinptr)0x0) {
          if (pmVar24->child[0] == (tbinptr)0x0) {
            pmVar18 = (tbinptr)0x0;
            goto LAB_00104251;
          }
          pmVar22 = pmVar24->child[0];
          ppmVar16 = pmVar24->child;
        }
        else {
          pmVar22 = pmVar24->child[1];
          ppmVar16 = pmVar24->child + 1;
        }
        do {
          do {
            ppmVar32 = ppmVar16;
            pmVar18 = pmVar22;
            pmVar22 = pmVar18->child[1];
            ppmVar16 = pmVar18->child + 1;
          } while (pmVar18->child[1] != (malloc_tree_chunk *)0x0);
          pmVar22 = pmVar18->child[0];
          ppmVar16 = pmVar18->child;
        } while (pmVar18->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar32 < _gm_.least_addr) goto LAB_00104a4d;
        *ppmVar32 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar7 = pmVar24->fd;
        if (((pmVar7 < _gm_.least_addr) || (pmVar7->bk != pmVar24)) || (pmVar18->fd != pmVar24))
        goto LAB_00104a4d;
        pmVar7->bk = pmVar18;
        pmVar18->fd = pmVar7;
      }
LAB_00104251:
      pmVar22 = (tbinptr)_gm_.least_addr;
      if (pmVar12 != (malloc_tree_chunk *)0x0) {
        uVar27 = pmVar24->index;
        if (pmVar24 == _gm_.treebins[uVar27]) {
          _gm_.treebins[uVar27] = pmVar18;
          pmVar22 = (tbinptr)_gm_.least_addr;
          if (pmVar18 == (tbinptr)0x0) {
            bVar34 = (byte)uVar27 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar34 | 0xfffffffeU >> 0x20 - bVar34);
          }
          else {
LAB_001042a2:
            if (pmVar18 < pmVar22) goto LAB_00104a4d;
            pmVar18->parent = pmVar12;
            pmVar8 = pmVar24->child[0];
            if (pmVar8 != (tbinptr)0x0) {
              if (pmVar8 < pmVar22) goto LAB_00104a4d;
              pmVar18->child[0] = pmVar8;
              pmVar8->parent = pmVar18;
            }
            pmVar8 = pmVar24->child[1];
            if (pmVar8 != (tbinptr)0x0) {
              if (pmVar8 < pmVar22) goto LAB_00104a4d;
              pmVar18->child[1] = pmVar8;
              pmVar8->parent = pmVar18;
            }
          }
        }
        else {
          if (pmVar12 < _gm_.least_addr) goto LAB_00104a4d;
          pmVar12->child[pmVar12->child[0] != pmVar24] = pmVar18;
          if (pmVar18 != (tbinptr)0x0) goto LAB_001042a2;
        }
      }
      if (uVar29 < 0x20) goto LAB_0010430e;
      pmVar21 = (mchunkptr)(pcVar28 + (long)&pmVar24->prev_foot);
      pmVar24->head = (ulong)pcVar28 | 3;
      *(ulong *)((long)&pmVar24->head + (long)pcVar28) = uVar29 | 1;
      *(ulong *)((long)&pmVar21->prev_foot + uVar29) = uVar29;
      pmVar30 = _gm_.dv;
      uVar39 = _gm_.dvsize >> 3;
      if (_gm_.dvsize < 0x100) {
        if (_gm_.dvsize == 0) goto LAB_00103a45;
        pmVar31 = (malloc_chunk *)(_gm_.smallbins + uVar39 * 2);
        if (_gm_.dvsize < 0x20) {
          _PDCLIB_assert99("Assertion failed: DVS >= MIN_CHUNK_SIZE, function ","tmalloc_small",
                           ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4594.\n"
                          );
        }
      }
      else {
        _PDCLIB_assert99("Assertion failed: is_small(DVS), function ","tmalloc_small",
                         ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4594.\n"
                        );
        pmVar31 = (malloc_chunk *)(_gm_.smallbins + (uint)uVar39 * 2);
        pmVar30 = _gm_.dv;
      }
      if ((_gm_.smallmap >> ((uint)uVar39 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar39 & 0x1f);
        pmVar15 = pmVar31;
      }
      else {
        pmVar15 = pmVar31->fd;
        if (pmVar31->fd < _gm_.least_addr) goto LAB_00104a4d;
      }
      pmVar31->fd = pmVar30;
      pmVar15->bk = pmVar30;
      pmVar30->fd = pmVar15;
      pmVar30->bk = pmVar31;
      goto LAB_00103a45;
    }
    uVar10 = 2 << (bVar34 & 0x1f);
    uVar27 = (-uVar10 | uVar10) & uVar27 << (bVar34 & 0x1f);
    iVar11 = 0;
    if (uVar27 != 0) {
      for (; (uVar27 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
      }
    }
    uVar29 = (ulong)(uint)(iVar11 << 4);
    pcVar36 = (char *)((long)_gm_.smallbins + uVar29);
    pcVar38 = *(char **)((long)_gm_.smallbins + uVar29 + 0x10);
    uVar39 = (ulong)(uint)(iVar11 * 8);
    if ((*(ulong *)(pcVar38 + 8) & 0xfffffffffffffff8) != uVar39) {
      _PDCLIB_assert99("Assertion failed: chunksize(p) == small_index2size(i), function ","malloc",
                       ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4667.\n"
                      );
    }
    pcVar6 = *(char **)(pcVar38 + 0x10);
    if (pcVar38 == pcVar36) {
      _PDCLIB_assert99("Assertion failed: p != b, function ","malloc",
                       ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4668.\n"
                      );
    }
    if (pcVar38 == pcVar6) {
      _PDCLIB_assert99("Assertion failed: p != F, function ","malloc",
                       ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4668.\n"
                      );
    }
    if ((*(ulong *)(pcVar38 + 8) & 0xfffffffffffffff8) != uVar39) {
      _PDCLIB_assert99("Assertion failed: chunksize(p) == small_index2size(i), function ","malloc",
                       ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4668.\n"
                      );
    }
    if (pcVar36 == pcVar6) {
      bVar34 = (byte)iVar11 & 0x1f;
      _gm_.smallmap = _gm_.smallmap & (-2 << bVar34 | 0xfffffffeU >> 0x20 - bVar34);
    }
    else {
      if ((pcVar6 < _gm_.least_addr) || (*(char **)(pcVar6 + 0x18) != pcVar38)) goto LAB_00104a4d;
      *(char **)(pcVar6 + 0x18) = pcVar36;
      *(char **)((long)_gm_.smallbins + uVar29 + 0x10) = pcVar6;
    }
    ppmVar16 = (malloc_tree_chunk **)(pcVar38 + 0x10);
    uVar29 = uVar39 - (long)pcVar28;
    if (uVar29 < 0x20) {
      *(ulong *)(pcVar38 + 8) = uVar39 | 3;
      pcVar38[uVar39 + 8] = pcVar38[uVar39 + 8] | 1;
      goto LAB_00103a49;
    }
    *(ulong *)(pcVar38 + 8) = (ulong)pcVar28 | 3;
    *(ulong *)(pcVar38 + 8 + (long)pcVar28) = uVar29 | 1;
    *(ulong *)(pcVar38 + uVar39) = uVar29;
    pmVar21 = _gm_.dv;
    uVar39 = _gm_.dvsize >> 3;
    if (_gm_.dvsize < 0x100) {
      if (_gm_.dvsize != 0) {
        pmVar31 = (malloc_chunk *)(_gm_.smallbins + uVar39 * 2);
        if (_gm_.dvsize < 0x20) {
          _PDCLIB_assert99("Assertion failed: DVS >= MIN_CHUNK_SIZE, function ","malloc",
                           ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4677.\n"
                          );
        }
        goto LAB_00103e21;
      }
    }
    else {
      _PDCLIB_assert99("Assertion failed: is_small(DVS), function ","malloc",
                       ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4677.\n"
                      );
      pmVar31 = (malloc_chunk *)(_gm_.smallbins + (uint)uVar39 * 2);
      pmVar21 = _gm_.dv;
LAB_00103e21:
      if ((_gm_.smallmap >> ((uint)uVar39 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar39 & 0x1f);
        pmVar15 = pmVar31;
      }
      else {
        pmVar15 = pmVar31->fd;
        if (pmVar31->fd < _gm_.least_addr) goto LAB_00104a4d;
      }
      pmVar31->fd = pmVar21;
      pmVar15->bk = pmVar21;
      pmVar21->fd = pmVar15;
      pmVar21->bk = pmVar31;
    }
    _gm_.dv = (mchunkptr)(pcVar38 + (long)pcVar28);
    _gm_.dvsize = uVar29;
    goto LAB_00103a49;
  }
  pcVar28 = (char *)0xffffffffffffffff;
  if (__size < 0xffffffffffffff80) {
    pcVar28 = (char *)(__size + 0x17 & 0xfffffffffffffff0);
    if (_gm_.treemap == 0) goto LAB_00103921;
    uVar27 = (uint)(__size + 0x17 >> 8);
    if (uVar27 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0x1f;
      if (uVar27 < 0x10000) {
        uVar10 = 0x1f;
        if (uVar27 != 0) {
          for (; uVar27 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        uVar10 = (uint)(((ulong)pcVar28 >> ((ulong)(byte)(0x26 - (char)(uVar10 ^ 0x1f)) & 0x3f) & 1)
                       != 0) + (uVar10 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    uVar29 = -(long)pcVar28;
    pmVar22 = _gm_.treebins[uVar10];
    if (pmVar22 == (tbinptr)0x0) {
      pmVar12 = (malloc_tree_chunk *)0x0;
      pmVar24 = (tbinptr)0x0;
    }
    else {
      bVar34 = 0x39 - (char)(uVar10 >> 1);
      if (uVar10 == 0x1f) {
        bVar34 = 0;
      }
      lVar26 = (long)pcVar28 << (bVar34 & 0x3f);
      pmVar12 = (malloc_tree_chunk *)0x0;
      pmVar24 = (tbinptr)0x0;
      do {
        uVar39 = (pmVar22->head & 0xfffffffffffffff8) - (long)pcVar28;
        if ((uVar39 < uVar29) && (pmVar24 = pmVar22, uVar29 = uVar39, uVar39 == 0)) {
          uVar29 = 0;
          goto LAB_00103853;
        }
        pmVar7 = pmVar22->child[1];
        pmVar22 = *(tbinptr *)((long)pmVar22 + (lVar26 >> 0x3f) * -8 + 0x20);
        pmVar20 = pmVar7;
        if (pmVar7 == pmVar22) {
          pmVar20 = pmVar12;
        }
        if (pmVar7 != (malloc_tree_chunk *)0x0) {
          pmVar12 = pmVar20;
        }
        lVar26 = lVar26 * 2;
      } while (pmVar22 != (malloc_tree_chunk *)0x0);
    }
    if (pmVar12 == (malloc_tree_chunk *)0x0 && pmVar24 == (tbinptr)0x0) {
      uVar27 = 2 << ((byte)uVar10 & 0x1f);
      uVar27 = (-uVar27 | uVar27) & _gm_.treemap;
      if (uVar27 == 0) goto LAB_00103921;
      uVar10 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      pmVar24 = (tbinptr)0x0;
      pmVar12 = _gm_.treebins[uVar10];
    }
    while (pmVar22 = pmVar12, pmVar22 != (malloc_tree_chunk *)0x0) {
LAB_00103853:
      uVar37 = (pmVar22->head & 0xfffffffffffffff8) - (long)pcVar28;
      uVar39 = uVar37;
      if (uVar29 <= uVar37) {
        uVar39 = uVar29;
      }
      if (uVar29 > uVar37) {
        pmVar24 = pmVar22;
      }
      pmVar12 = pmVar22->child[0];
      uVar29 = uVar39;
      if (pmVar22->child[0] == (malloc_tree_chunk *)0x0) {
        pmVar12 = pmVar22->child[1];
      }
    }
    if ((pmVar24 == (tbinptr)0x0) || (_gm_.dvsize - (long)pcVar28 <= uVar29)) goto LAB_00103921;
    if (pmVar24 < _gm_.least_addr) goto LAB_00104a4d;
    pcVar38 = pcVar28 + uVar29;
    if ((char *)(pmVar24->head & 0xfffffffffffffff8) != pcVar38) {
      _PDCLIB_assert99("Assertion failed: chunksize(v) == rsize + nb, function ","tmalloc_large",
                       ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4548.\n"
                      );
    }
    if ((long)pcVar28 < 1) goto LAB_00104a4d;
    pmVar12 = pmVar24->bk;
    pmVar7 = pmVar24->parent;
    if (pmVar12 == pmVar24) {
      if (pmVar24->child[1] == (malloc_tree_chunk *)0x0) {
        if (pmVar24->child[0] == (malloc_tree_chunk *)0x0) {
          pmVar12 = (malloc_tree_chunk *)0x0;
          goto LAB_00103fc5;
        }
        pmVar20 = pmVar24->child[0];
        ppmVar16 = pmVar24->child;
      }
      else {
        pmVar20 = pmVar24->child[1];
        ppmVar16 = pmVar24->child + 1;
      }
      do {
        do {
          ppmVar32 = ppmVar16;
          pmVar12 = pmVar20;
          pmVar20 = pmVar12->child[1];
          ppmVar16 = pmVar12->child + 1;
        } while (pmVar12->child[1] != (malloc_tree_chunk *)0x0);
        pmVar20 = pmVar12->child[0];
        ppmVar16 = pmVar12->child;
      } while (pmVar12->child[0] != (malloc_tree_chunk *)0x0);
      if (ppmVar32 < _gm_.least_addr) goto LAB_00104a4d;
      *ppmVar32 = (malloc_tree_chunk *)0x0;
    }
    else {
      pmVar20 = pmVar24->fd;
      if (((pmVar20 < _gm_.least_addr) || (pmVar20->bk != pmVar24)) || (pmVar12->fd != pmVar24))
      goto LAB_00104a4d;
      pmVar20->bk = pmVar12;
      pmVar12->fd = pmVar20;
    }
LAB_00103fc5:
    pmVar20 = (malloc_tree_chunk *)_gm_.least_addr;
    if (pmVar7 != (malloc_tree_chunk *)0x0) {
      uVar27 = pmVar24->index;
      if (pmVar24 == _gm_.treebins[uVar27]) {
        _gm_.treebins[uVar27] = pmVar12;
        pmVar20 = (malloc_tree_chunk *)_gm_.least_addr;
        if (pmVar12 == (malloc_tree_chunk *)0x0) {
          bVar34 = (byte)uVar27 & 0x1f;
          _gm_.treemap = _gm_.treemap & (-2 << bVar34 | 0xfffffffeU >> 0x20 - bVar34);
        }
        else {
LAB_00104016:
          if (pmVar12 < pmVar20) goto LAB_00104a4d;
          pmVar12->parent = pmVar7;
          pmVar7 = pmVar24->child[0];
          if (pmVar7 != (malloc_tree_chunk *)0x0) {
            if (pmVar7 < pmVar20) goto LAB_00104a4d;
            pmVar12->child[0] = pmVar7;
            pmVar7->parent = pmVar12;
          }
          pmVar7 = pmVar24->child[1];
          if (pmVar7 != (malloc_tree_chunk *)0x0) {
            if (pmVar7 < pmVar20) goto LAB_00104a4d;
            pmVar12->child[1] = pmVar7;
            pmVar7->parent = pmVar12;
          }
        }
      }
      else {
        if (pmVar7 < _gm_.least_addr) goto LAB_00104a4d;
        pmVar7->child[pmVar7->child[0] != pmVar24] = pmVar12;
        if (pmVar12 != (malloc_tree_chunk *)0x0) goto LAB_00104016;
      }
    }
    if (uVar29 < 0x20) {
LAB_0010430e:
      pmVar24->head = (ulong)pcVar38 | 3;
      pbVar5 = (byte *)((long)&pmVar24->head + (long)pcVar38);
      *pbVar5 = *pbVar5 | 1;
      uVar29 = _gm_.dvsize;
      pmVar21 = _gm_.dv;
    }
    else {
      pmVar31 = (malloc_chunk *)(pcVar28 + (long)&pmVar24->prev_foot);
      pmVar24->head = (ulong)pcVar28 | 3;
      *(ulong *)((long)&pmVar24->head + (long)pcVar28) = uVar29 | 1;
      *(ulong *)((long)&pmVar31->prev_foot + uVar29) = uVar29;
      if (uVar29 < 0x100) {
        uVar29 = uVar29 >> 3;
        if ((_gm_.smallmap >> ((uint)uVar29 & 0x1f) & 1) == 0) {
          _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar29 & 0x1f);
          pmVar21 = (malloc_chunk *)(_gm_.smallbins + uVar29 * 2);
        }
        else {
          pmVar21 = _gm_.smallbins[uVar29 * 2 + 2];
          if (_gm_.smallbins[uVar29 * 2 + 2] < _gm_.least_addr) goto LAB_00104a4d;
        }
        _gm_.smallbins[uVar29 * 2 + 2] = pmVar31;
        pmVar21->bk = pmVar31;
        pmVar31->fd = pmVar21;
        pmVar31->bk = (malloc_chunk *)(_gm_.smallbins + uVar29 * 2);
        uVar29 = _gm_.dvsize;
        pmVar21 = _gm_.dv;
      }
      else {
        uVar27 = (uint)(uVar29 >> 8);
        if (uVar27 == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = 0x1f;
          if (uVar27 < 0x10000) {
            uVar10 = 0x1f;
            if (uVar27 != 0) {
              for (; uVar27 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            uVar10 = (uint)((uVar29 >> ((ulong)(byte)(0x26 - (char)(uVar10 ^ 0x1f)) & 0x3f) & 1) !=
                           0) + (uVar10 ^ 0x1f) * 2 ^ 0x3e;
          }
        }
        pmVar15 = (malloc_chunk *)(_gm_.treebins + uVar10);
        *(uint *)&pmVar31[1].bk = uVar10;
        pmVar31[1].prev_foot = 0;
        pmVar31[1].head = 0;
        if ((_gm_.treemap >> (uVar10 & 0x1f) & 1) == 0) {
          _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar10 & 0x1f);
          pmVar15->prev_foot = (size_t)pmVar31;
          pmVar31[1].fd = pmVar15;
        }
        else {
          bVar34 = 0x39 - (char)(uVar10 >> 1);
          if (uVar10 == 0x1f) {
            bVar34 = 0;
          }
          lVar26 = uVar29 << (bVar34 & 0x3f);
          pmVar15 = (malloc_chunk *)pmVar15->prev_foot;
          do {
            pmVar25 = pmVar15;
            if ((pmVar25->head & 0xfffffffffffffff8) == uVar29) {
              if ((pmVar25 < _gm_.least_addr) || (pmVar15 = pmVar25->fd, pmVar15 < _gm_.least_addr))
              goto LAB_00104a4d;
              pmVar15->bk = pmVar31;
              pmVar25->fd = pmVar31;
              pmVar31->fd = pmVar15;
              pmVar31->bk = pmVar25;
              pmVar31[1].fd = (malloc_chunk *)0x0;
              uVar29 = _gm_.dvsize;
              pmVar21 = _gm_.dv;
              goto LAB_00103a45;
            }
            lVar33 = lVar26 >> 0x3f;
            lVar26 = lVar26 * 2;
            pmVar15 = *(malloc_chunk **)((long)pmVar25 + lVar33 * -8 + 0x20);
          } while (pmVar15 != (malloc_chunk *)0x0);
          plVar3 = (long *)((long)pmVar25 + lVar33 * -8 + 0x20);
          if (plVar3 < _gm_.least_addr) goto LAB_00104a4d;
          *plVar3 = (long)pmVar31;
          pmVar31[1].fd = pmVar25;
        }
        pmVar31->bk = pmVar31;
        pmVar31->fd = pmVar31;
        uVar29 = _gm_.dvsize;
        pmVar21 = _gm_.dv;
      }
    }
  }
  else {
LAB_00103921:
    uVar29 = _gm_.dvsize - (long)pcVar28;
    if (_gm_.dvsize < pcVar28) {
      uVar29 = _gm_.topsize - (long)pcVar28;
      if (_gm_.topsize < pcVar28 || uVar29 == 0) {
        if (mparams.magic == 0) {
          init_mparams();
        }
        if (((((byte)_gm_.mflags & 1) != 0) && (mparams.mmap_threshold <= pcVar28)) &&
           (_gm_.topsize != 0)) {
          pcVar38 = (char *)(-mparams.page_size & (ulong)(pcVar28 + mparams.page_size + 0x3e));
          if (_gm_.footprint_limit == 0) {
            if (pcVar28 < pcVar38) goto LAB_00103a77;
          }
          else if ((pcVar28 < pcVar38 && _gm_.footprint < pcVar38 + _gm_.footprint) &&
                   pcVar38 + _gm_.footprint <= _gm_.footprint_limit) {
LAB_00103a77:
            if (dev_zero_fd < 0) {
              dev_zero_fd = open("/dev/zero",2);
            }
            pcVar36 = (char *)mmap((void *)0x0,(size_t)pcVar38,3,2,dev_zero_fd,0);
            if (pcVar36 != (char *)0xffffffffffffffff) {
              uVar29 = (ulong)(-(int)pcVar36 - 0x10U & 0xf);
              *(ulong *)(pcVar36 + uVar29) = uVar29;
              *(char **)(pcVar36 + uVar29 + 8) = pcVar38 + (-0x20 - uVar29);
              pcVar28 = pcVar36 + (long)(pcVar38 + -0x18);
              pcVar28[0] = '\v';
              pcVar28[1] = '\0';
              pcVar28[2] = '\0';
              pcVar28[3] = '\0';
              pcVar28[4] = '\0';
              pcVar28[5] = '\0';
              pcVar28[6] = '\0';
              pcVar28[7] = '\0';
              pcVar28 = pcVar36 + -0x10 + (long)pcVar38;
              pcVar28[0] = '\0';
              pcVar28[1] = '\0';
              pcVar28[2] = '\0';
              pcVar28[3] = '\0';
              pcVar28[4] = '\0';
              pcVar28[5] = '\0';
              pcVar28[6] = '\0';
              pcVar28[7] = '\0';
              if ((_gm_.least_addr == (char *)0x0) || (pcVar36 < _gm_.least_addr)) {
                _gm_.least_addr = pcVar36;
              }
              _gm_.footprint = (size_t)(pcVar38 + _gm_.footprint);
              if (_gm_.max_footprint < _gm_.footprint) {
                _gm_.max_footprint = _gm_.footprint;
              }
              ppmVar16 = (malloc_tree_chunk **)(pcVar36 + uVar29 + 0x10);
              if (((ulong)ppmVar16 & 0xf) != 0) {
                _PDCLIB_assert99("Assertion failed: is_aligned(chunk2mem(p)), function ",
                                 "mmap_alloc",
                                 ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 3911.\n"
                                );
              }
              goto LAB_00103a49;
            }
          }
        }
        iVar11 = malloc_global_mutex;
        pcVar38 = (char *)(-mparams.granularity & (ulong)(pcVar28 + mparams.granularity + 0x5f));
        if ((pcVar28 < pcVar38) &&
           ((_gm_.footprint_limit == 0 ||
            (pcVar38 + _gm_.footprint <= _gm_.footprint_limit &&
             _gm_.footprint < pcVar38 + _gm_.footprint)))) {
          if (((byte)_gm_.mflags & 4) == 0) {
            if (_gm_.top != (mchunkptr)0x0) {
              pmVar17 = &_gm_.seg;
              do {
                if (((mchunkptr)pmVar17->base <= _gm_.top) &&
                   (_gm_.top <
                    (mchunkptr)((long)&((mchunkptr)pmVar17->base)->prev_foot + pmVar17->size)))
                goto LAB_00103be7;
                pmVar17 = pmVar17->next;
              } while (pmVar17 != (malloc_segment *)0x0);
            }
            pmVar17 = (malloc_segment *)0x0;
LAB_00103be7:
            uVar27 = 1;
            LOCK();
            malloc_global_mutex = 1;
            UNLOCK();
            if (iVar11 != 0) {
              while (malloc_global_mutex != 0) {
                if ((uVar27 & 0x3f) == 0) {
                  sched_yield();
                }
                uVar27 = uVar27 + 1;
              }
              LOCK();
              UNLOCK();
            }
            malloc_global_mutex = 1;
            if (pmVar17 == (malloc_segment *)0x0) {
              m = (mstate)sbrk(0);
              if (m != (mstate)0xffffffffffffffff) {
                pcVar36 = pcVar38;
                if ((mparams.page_size - 1 & (ulong)m) != 0) {
                  pcVar36 = pcVar38 + ((-mparams.page_size &
                                       (long)m->smallbins + (mparams.page_size - 0x49)) - (long)m);
                }
                if ((pcVar36 < (char *)0x7fffffffffffffff && pcVar28 < pcVar36) &&
                   ((_gm_.footprint_limit == 0 ||
                    (pcVar36 + _gm_.footprint <= _gm_.footprint_limit &&
                     _gm_.footprint < pcVar36 + _gm_.footprint)))) {
                  pmVar13 = (mstate)sbrk((intptr_t)pcVar36);
                  if (pmVar13 != m) goto LAB_00103f29;
                  goto LAB_0010454d;
                }
              }
LAB_00104443:
              _gm_.mflags._0_1_ = (byte)_gm_.mflags | 4;
              malloc_global_mutex = 0;
              goto LAB_0010445e;
            }
            pcVar36 = (char *)(-mparams.granularity &
                              (ulong)(pcVar28 + mparams.granularity + (0x5f - _gm_.topsize)));
            if ((char *)0x7ffffffffffffffe < pcVar36) goto LAB_00104443;
            pmVar13 = (mstate)sbrk((intptr_t)pcVar36);
            if (pmVar13 == (mstate)(pmVar17->base + pmVar17->size)) {
joined_r0x001042e9:
              m = pmVar13;
              if (pmVar13 == (mstate)0xffffffffffffffff) goto LAB_00104443;
            }
            else {
LAB_00103f29:
              if ((pcVar28 + 0x60 <= pcVar36) || (pmVar13 == (mstate)0xffffffffffffffff))
              goto joined_r0x001042e9;
              uVar29 = -mparams.granularity &
                       (ulong)(pcVar28 + mparams.granularity + (0x5f - (long)pcVar36));
              m = pmVar13;
              if (uVar29 < 0x7fffffffffffffff) {
                pvVar14 = sbrk(uVar29);
                if (pvVar14 == (void *)0xffffffffffffffff) {
                  sbrk(-(long)pcVar36);
                  goto LAB_00104443;
                }
                pcVar36 = pcVar36 + uVar29;
              }
            }
LAB_0010454d:
            malloc_global_mutex = 0;
            bVar40 = false;
            pcVar38 = pcVar36;
LAB_0010454f:
            pmVar21 = _gm_.top;
            _gm_.footprint = (size_t)(pcVar38 + _gm_.footprint);
            if (_gm_.max_footprint < _gm_.footprint) {
              _gm_.max_footprint = _gm_.footprint;
            }
            uVar27 = (uint)bVar40;
            if (_gm_.top == (mchunkptr)0x0) {
              if ((_gm_.least_addr == (char *)0x0) || (m < _gm_.least_addr)) {
                _gm_.least_addr = (char *)m;
              }
              _gm_.magic = mparams.magic;
              _gm_.release_checks = 0xfff;
              lVar26 = 0x20;
              lVar33 = 0x10fd28;
              _gm_.seg.base = (char *)m;
              _gm_.seg.size = (size_t)pcVar38;
              _gm_.seg.sflags = uVar27;
              do {
                *(long *)(lVar33 + 0x18) = lVar33;
                *(long *)(lVar33 + 0x10) = lVar33;
                lVar33 = lVar33 + 0x10;
                lVar26 = lVar26 + -1;
              } while (lVar26 != 0);
              uVar29 = (ulong)(-(int)m - 0x10U & 0xf);
              _gm_.top = (mchunkptr)((long)m->smallbins + (uVar29 - 0x48));
              _gm_.topsize = (size_t)(pcVar38 + (-0x50 - uVar29));
              *(size_t *)((long)m->smallbins + (uVar29 - 0x40)) = _gm_.topsize | 1;
              pcVar38 = (char *)((long)&m[-1].max_footprint + (long)pcVar38);
              pcVar38[0] = 'P';
              pcVar38[1] = '\0';
              pcVar38[2] = '\0';
              pcVar38[3] = '\0';
              pcVar38[4] = '\0';
              pcVar38[5] = '\0';
              pcVar38[6] = '\0';
              pcVar38[7] = '\0';
LAB_001046a0:
              _gm_.trim_check = mparams.trim_threshold;
            }
            else {
              pmVar17 = &_gm_.seg;
              do {
                if (m == (mstate)((long)&((mchunkptr)pmVar17->base)->prev_foot + pmVar17->size)) {
                  if ((((_gm_.top < m) && ((mchunkptr)pmVar17->base <= _gm_.top)) &&
                      ((pmVar17->sflags & 8) == 0)) && (((pmVar17->sflags ^ uVar27) & 1) == 0)) {
                    pmVar17->size = (size_t)(pcVar38 + pmVar17->size);
                    pcVar38 = pcVar38 + _gm_.topsize;
                    uVar29 = (ulong)(-(int)_gm_.top - 0x10U & 0xf);
                    _gm_.topsize = (long)pcVar38 - uVar29;
                    psVar4 = &(_gm_.top)->head;
                    _gm_.top = (mchunkptr)((long)&(_gm_.top)->prev_foot + uVar29);
                    *(size_t *)((long)psVar4 + uVar29) = _gm_.topsize | 1;
                    pcVar38 = (char *)((long)&pmVar21->head + (long)pcVar38);
                    pcVar38[0] = 'P';
                    pcVar38[1] = '\0';
                    pcVar38[2] = '\0';
                    pcVar38[3] = '\0';
                    pcVar38[4] = '\0';
                    pcVar38[5] = '\0';
                    pcVar38[6] = '\0';
                    pcVar38[7] = '\0';
                    goto LAB_001046a0;
                  }
                  break;
                }
                pmVar17 = pmVar17->next;
              } while (pmVar17 != (malloc_segment *)0x0);
              if (m < _gm_.least_addr) {
                _gm_.least_addr = (char *)m;
              }
              pmVar17 = &_gm_.seg;
              do {
                pcVar36 = pmVar17->base;
                if (pcVar36 == pcVar38 + (long)(m->smallbins + -9)) {
                  if (((pmVar17->sflags & 8) == 0) &&
                     (uVar10 = pmVar17->sflags ^ uVar27, (uVar10 & 1) == 0)) {
                    pmVar17->base = (char *)m;
                    pmVar17->size = (size_t)(pcVar38 + pmVar17->size);
                    ppmVar16 = (malloc_tree_chunk **)prepend_alloc(m,pcVar36,pcVar28,(ulong)uVar10);
                    goto LAB_00103a49;
                  }
                  break;
                }
                pmVar17 = pmVar17->next;
              } while (pmVar17 != (malloc_segment *)0x0);
              for (pmVar17 = &_gm_.seg;
                  (_gm_.top < (mchunkptr)pmVar17->base ||
                  (pmVar30 = (mchunkptr)
                             ((long)&((mchunkptr)pmVar17->base)->prev_foot + pmVar17->size),
                  pmVar30 <= _gm_.top)); pmVar17 = pmVar17->next) {
              }
              pmVar35 = (mchunkptr)((long)pmVar30 + ((ulong)(0x4fU - (int)pmVar30 & 0xf) - 0x5f));
              pmVar1 = _gm_.top + 1;
              if (pmVar35 < pmVar1) {
                pmVar35 = _gm_.top;
              }
              ppmVar2 = &pmVar35->fd;
              uVar29 = (ulong)(-(int)m - 0x10U & 0xf);
              _gm_.top = (mchunkptr)((long)m->smallbins + (uVar29 - 0x48));
              _gm_.topsize = (size_t)(pcVar38 + (-0x50 - uVar29));
              *(size_t *)((long)m->smallbins + (uVar29 - 0x40)) = _gm_.topsize | 1;
              pcVar36 = (char *)((long)&m[-1].max_footprint + (long)pcVar38);
              pcVar36[0] = 'P';
              pcVar36[1] = '\0';
              pcVar36[2] = '\0';
              pcVar36[3] = '\0';
              pcVar36[4] = '\0';
              pcVar36[5] = '\0';
              pcVar36[6] = '\0';
              pcVar36[7] = '\0';
              _gm_.trim_check = mparams.trim_threshold;
              if (((ulong)ppmVar2 & 0xf) != 0) {
                _PDCLIB_assert99("Assertion failed: is_aligned(ss), function ","add_segment",
                                 ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4064.\n"
                                );
              }
              pmVar35->head = 0x33;
              sVar9 = CONCAT44(_gm_.seg._28_4_,_gm_.seg.sflags);
              pmVar35[1].prev_foot = (size_t)_gm_.seg.next;
              pmVar35[1].head = sVar9;
              *ppmVar2 = (malloc_chunk *)_gm_.seg.base;
              pmVar35->bk = (malloc_chunk *)_gm_.seg.size;
              ppmVar23 = &pmVar35[1].bk;
              iVar11 = 1;
              _gm_.seg.base = (char *)m;
              _gm_.seg.size = (size_t)pcVar38;
              _gm_.seg.next = (malloc_segment *)ppmVar2;
              _gm_.seg.sflags = uVar27;
              do {
                *ppmVar23 = (malloc_chunk *)0xb;
                iVar11 = iVar11 + -1;
                ppmVar23 = ppmVar23 + 1;
              } while (ppmVar23 < pmVar30);
              if (iVar11 == 0) {
                _PDCLIB_assert99("Assertion failed: nfences >= 2, function ","add_segment",
                                 ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4082.\n"
                                );
              }
              uVar29 = (long)pmVar35 - (long)pmVar21;
              if (uVar29 != 0) {
                *(byte *)&pmVar35->head = (byte)pmVar35->head & 0xfe;
                pmVar21->head = uVar29 | 1;
                pmVar35->prev_foot = uVar29;
                if (uVar29 < 0x100) {
                  uVar39 = uVar29 >> 3;
                  if (uVar29 < 0x20) {
                    _PDCLIB_assert99("Assertion failed: psize >= MIN_CHUNK_SIZE, function ",
                                     "add_segment",
                                     ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_dlmalloc/malloc.c, line 4090.\n"
                                    );
                  }
                  if ((_gm_.smallmap >> ((uint)uVar39 & 0x1f) & 1) == 0) {
                    _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar39 & 0x1f);
                    pmVar24 = (tbinptr)(_gm_.smallbins + uVar39 * 2);
                  }
                  else {
                    pmVar24 = (tbinptr)_gm_.smallbins[uVar39 * 2 + 2];
                    if ((tbinptr)_gm_.smallbins[uVar39 * 2 + 2] < _gm_.least_addr) {
LAB_00104a4d:
                      abort();
                    }
                  }
                  _gm_.smallbins[uVar39 * 2 + 2] = pmVar21;
                  pmVar24->bk = (malloc_tree_chunk *)pmVar21;
                  lVar26 = 0x18;
                  lVar33 = 0x10;
                  pmVar18 = (tbinptr)(_gm_.smallbins + uVar39 * 2);
                }
                else {
                  uVar27 = (uint)(uVar29 >> 8);
                  if (uVar27 == 0) {
                    uVar10 = 0;
                  }
                  else {
                    uVar10 = 0x1f;
                    if (uVar27 < 0x10000) {
                      uVar10 = 0x1f;
                      if (uVar27 != 0) {
                        for (; uVar27 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                        }
                      }
                      uVar10 = (uint)((uVar29 >> ((ulong)(byte)(0x26 - (char)(uVar10 ^ 0x1f)) & 0x3f
                                                 ) & 1) != 0) + (uVar10 ^ 0x1f) * 2 ^ 0x3e;
                    }
                  }
                  pmVar31 = (malloc_chunk *)(_gm_.treebins + uVar10);
                  *(uint *)&pmVar21[1].bk = uVar10;
                  pmVar1->prev_foot = 0;
                  pmVar21[1].head = 0;
                  if ((_gm_.treemap >> (uVar10 & 0x1f) & 1) == 0) {
                    _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar10 & 0x1f);
                    pmVar31->prev_foot = (size_t)pmVar21;
                    pmVar21[1].fd = pmVar31;
                  }
                  else {
                    bVar34 = 0x39 - (char)(uVar10 >> 1);
                    if (uVar10 == 0x1f) {
                      bVar34 = 0;
                    }
                    lVar26 = uVar29 << (bVar34 & 0x3f);
                    pmVar18 = (tbinptr)pmVar31->prev_foot;
                    do {
                      pmVar24 = pmVar18;
                      if ((pmVar24->head & 0xfffffffffffffff8) == uVar29) {
                        if ((pmVar24 < _gm_.least_addr) ||
                           (pmVar12 = pmVar24->fd, pmVar12 < _gm_.least_addr)) goto LAB_00104a4d;
                        pmVar12->bk = (malloc_tree_chunk *)pmVar21;
                        pmVar24->fd = (malloc_tree_chunk *)pmVar21;
                        pmVar21->fd = (malloc_chunk *)pmVar12;
                        lVar26 = 0x30;
                        lVar33 = 0x18;
                        pmVar18 = (tbinptr)0x0;
                        goto LAB_001049ff;
                      }
                      lVar33 = lVar26 >> 0x3f;
                      lVar26 = lVar26 * 2;
                      pmVar18 = *(tbinptr *)((long)pmVar24 + lVar33 * -8 + 0x20);
                    } while (pmVar18 != (tbinptr)0x0);
                    pcVar38 = (char *)((long)pmVar24 + lVar33 * -8 + 0x20);
                    if (pcVar38 < _gm_.least_addr) goto LAB_00104a4d;
                    *(mchunkptr *)pcVar38 = pmVar21;
                    pmVar21[1].fd = (malloc_chunk *)pmVar24;
                  }
                  lVar26 = 0x10;
                  lVar33 = 0x18;
                  pmVar18 = (tbinptr)pmVar21;
                  pmVar24 = (tbinptr)pmVar21;
                }
LAB_001049ff:
                *(tbinptr *)((long)&pmVar21->prev_foot + lVar33) = pmVar24;
                *(tbinptr *)((long)&pmVar21->prev_foot + lVar26) = pmVar18;
              }
            }
            pmVar18 = (tbinptr)_gm_.top;
            uVar29 = _gm_.topsize - (long)pcVar28;
            if (pcVar28 <= _gm_.topsize && uVar29 != 0) {
              psVar4 = &(_gm_.top)->head;
              _gm_.topsize = uVar29;
              _gm_.top = (mchunkptr)(pcVar28 + (long)&(_gm_.top)->prev_foot);
              *(ulong *)((long)psVar4 + (long)pcVar28) = uVar29 | 1;
              goto LAB_00103961;
            }
          }
          else {
LAB_0010445e:
            if (dev_zero_fd < 0) {
              dev_zero_fd = open("/dev/zero",2);
            }
            m = (mstate)mmap((void *)0x0,(size_t)pcVar38,3,2,dev_zero_fd,0);
            iVar11 = malloc_global_mutex;
            if (pcVar38 < (char *)0x7fffffffffffffff && m == (mstate)0xffffffffffffffff) {
              uVar27 = 1;
              LOCK();
              malloc_global_mutex = 1;
              UNLOCK();
              if (iVar11 != 0) {
                while (malloc_global_mutex != 0) {
                  if ((uVar27 & 0x3f) == 0) {
                    sched_yield();
                  }
                  uVar27 = uVar27 + 1;
                }
                LOCK();
                UNLOCK();
              }
              malloc_global_mutex = 1;
              m = (mstate)sbrk((intptr_t)pcVar38);
              pmVar13 = (mstate)sbrk(0);
              malloc_global_mutex = 0;
              if ((m < pmVar13 &&
                   (pmVar13 != (mstate)0xffffffffffffffff && m != (mstate)0xffffffffffffffff)) &&
                 (pcVar36 = (char *)((long)pmVar13 - (long)m), pcVar28 + 0x50 < pcVar36))
              goto LAB_0010454d;
            }
            else {
              bVar40 = m != (mstate)0xffffffffffffffff;
              if (bVar40) goto LAB_0010454f;
            }
          }
          piVar19 = _PDCLIB_errno_func();
          *piVar19 = 0xc;
        }
        ppmVar16 = (malloc_tree_chunk **)0x0;
        goto LAB_00103a49;
      }
      psVar4 = &(_gm_.top)->head;
      _gm_.topsize = uVar29;
      _gm_.top = (mchunkptr)(pcVar28 + (long)&(_gm_.top)->prev_foot);
      *(ulong *)((long)psVar4 + (long)pcVar28) = uVar29 | 1;
LAB_00103961:
      pmVar18->head = (ulong)pcVar28 | 3;
      pmVar24 = pmVar18;
      uVar29 = _gm_.dvsize;
      pmVar21 = _gm_.dv;
    }
    else {
      pmVar24 = (tbinptr)_gm_.dv;
      if (uVar29 < 0x20) {
        (_gm_.dv)->head = _gm_.dvsize | 3;
        pbVar5 = (byte *)((long)&(_gm_.dv)->head + _gm_.dvsize);
        *pbVar5 = *pbVar5 | 1;
        uVar29 = 0;
        pmVar21 = (mchunkptr)0x0;
      }
      else {
        *(ulong *)((long)&(_gm_.dv)->head + (long)pcVar28) = uVar29 | 1;
        *(ulong *)((long)&(_gm_.dv)->prev_foot + _gm_.dvsize) = uVar29;
        (_gm_.dv)->head = (ulong)pcVar28 | 3;
        pmVar21 = (mchunkptr)(pcVar28 + (long)&(_gm_.dv)->prev_foot);
      }
    }
  }
LAB_00103a45:
  _gm_.dv = pmVar21;
  _gm_.dvsize = uVar29;
  ppmVar16 = &pmVar24->fd;
LAB_00103a49:
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return ppmVar16;
}

Assistant:

void* dlmalloc(size_t bytes) {
  /*
     Basic algorithm:
     If a small request (< 256 bytes minus per-chunk overhead):
       1. If one exists, use a remainderless chunk in associated smallbin.
          (Remainderless means that there are too few excess bytes to
          represent as a chunk.)
       2. If it is big enough, use the dv chunk, which is normally the
          chunk adjacent to the one used for the most recent small request.
       3. If one exists, split the smallest available chunk in a bin,
          saving remainder in dv.
       4. If it is big enough, use the top chunk.
       5. If available, get memory from system and use it
     Otherwise, for a large request:
       1. Find the smallest available binned chunk that fits, and use it
          if it is better fitting than dv chunk, splitting if necessary.
       2. If better fitting than any binned chunk, use the dv chunk.
       3. If it is big enough, use the top chunk.
       4. If request size >= mmap threshold, try to directly mmap this chunk.
       5. If available, get memory from system and use it

     The ugly goto's here ensure that postaction occurs along all paths.
  */

#if USE_LOCKS
  ensure_initialization(); /* initialize in sys_alloc if not using locks */
#endif

  if (!PREACTION(gm)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = gm->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(gm, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(gm, b, p, idx);
        set_inuse_and_pinuse(gm, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }

      else if (nb > gm->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(gm, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(gm, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(gm, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(gm, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }

        else if (gm->treemap != 0 && (mem = tmalloc_small(gm, nb)) != 0) {
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (gm->treemap != 0 && (mem = tmalloc_large(gm, nb)) != 0) {
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }
    }

    if (nb <= gm->dvsize) {
      size_t rsize = gm->dvsize - nb;
      mchunkptr p = gm->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = gm->dv = chunk_plus_offset(p, nb);
        gm->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = gm->dvsize;
        gm->dvsize = 0;
        gm->dv = 0;
        set_inuse_and_pinuse(gm, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    else if (nb < gm->topsize) { /* Split top */
      size_t rsize = gm->topsize -= nb;
      mchunkptr p = gm->top;
      mchunkptr r = gm->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(gm, gm->top);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(gm, nb);

  postaction:
    POSTACTION(gm);
    return mem;
  }

  return 0;
}